

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall S2Builder::AddForcedSites(S2Builder *this,S2PointIndex<int> *site_index)

{
  VType *pVVar1;
  Vector3<double> *pVVar2;
  ulong uVar3;
  __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
  _Var4;
  pointer pVVar5;
  pointer pVVar6;
  long lVar7;
  ulong uVar8;
  PointData local_50;
  
  pVVar6 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar5 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar6 != pVVar5) {
    uVar3 = ((long)pVVar5 - (long)pVVar6 >> 3) * -0x5555555555555555;
    lVar7 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Vector3<double>*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pVVar6,pVVar5,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Vector3<double>*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pVVar6,pVVar5);
  }
  _Var4 = std::
          __unique<__gnu_cxx::__normal_iterator<Vector3<double>*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    ((this->sites_).
                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->sites_).
                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  pVVar2 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((_Var4._M_current != pVVar2) &&
     (pVVar6 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
     pVVar5 = (pointer)((long)_Var4._M_current + ((long)pVVar6 - (long)pVVar2)), pVVar6 != pVVar5))
  {
    (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar5;
  }
  pVVar6 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar6) {
    uVar3 = 0;
  }
  else {
    lVar7 = 0;
    uVar8 = 0;
    do {
      local_50.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.super__Tuple_impl<1UL,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl = SUB84(uVar8,0);
      local_50.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
      super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[2] =
           *(VType *)((long)pVVar6->c_ + lVar7 + 0x10);
      pVVar1 = (VType *)((long)pVVar6->c_ + lVar7);
      local_50.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
      super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0] = *pVVar1;
      local_50.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
      super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[1] = pVVar1[1];
      S2PointIndex<int>::Add(site_index,&local_50);
      uVar8 = uVar8 + 1;
      pVVar6 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->sites_).
                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pVVar6 >> 3) * -0x5555555555555555;
      lVar7 = lVar7 + 0x18;
    } while (uVar8 <= uVar3 && uVar3 - uVar8 != 0);
  }
  this->num_forced_sites_ = (SiteId)uVar3;
  return;
}

Assistant:

void S2Builder::AddForcedSites(S2PointIndex<SiteId>* site_index) {
  // Sort the forced sites and remove duplicates.
  std::sort(sites_.begin(), sites_.end());
  sites_.erase(std::unique(sites_.begin(), sites_.end()), sites_.end());
  // Add the forced sites to the index.
  for (SiteId id = 0; id < sites_.size(); ++id) {
    site_index->Add(sites_[id], id);
  }
  num_forced_sites_ = sites_.size();
}